

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_stdlib.hpp
# Opt level: O0

ModulePtr chaiscript::Std_Lib::library(void)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar2;
  string local_150;
  allocator<char> local_129;
  string local_128;
  anon_class_1_0_00000001_for_m_f local_101;
  Proxy_Function local_100;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  undefined1 local_11;
  shared_ptr<chaiscript::Module> *lib;
  
  local_11 = 0;
  Catch::clara::std::make_shared<chaiscript::Module>();
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::Bootstrap::bootstrap(peVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Vector",&local_49);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::standard_library::
  vector_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (&local_48,peVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"string",&local_71);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::standard_library::string_type<std::__cxx11::string>(&local_70,peVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Map",&local_99);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::standard_library::
  map_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (&local_98,peVar1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Pair",&local_c1);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::standard_library::pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            (&local_c0,peVar1);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"future",&local_e9);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>(&local_e8,peVar1);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  fun<chaiscript::Std_Lib::library()::_lambda(std::function<chaiscript::Boxed_Value()>const&)_1_>
            ((chaiscript *)&local_100,&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"async",&local_129);
  Module::add(peVar1,&local_100,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_100);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  json_wrap::library(peVar1);
  peVar1 = Catch::clara::std::
           __shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  ChaiScript_Prelude::chaiscript_prelude_abi_cxx11_();
  Module::eval(peVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] static ModulePtr library() {
      auto lib = std::make_shared<Module>();
      bootstrap::Bootstrap::bootstrap(*lib);

      bootstrap::standard_library::vector_type<std::vector<Boxed_Value>>("Vector", *lib);
      bootstrap::standard_library::string_type<std::string>("string", *lib);
      bootstrap::standard_library::map_type<std::map<std::string, Boxed_Value>>("Map", *lib);
      bootstrap::standard_library::pair_type<std::pair<Boxed_Value, Boxed_Value>>("Pair", *lib);

#ifndef CHAISCRIPT_NO_THREADS
      bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>("future", *lib);
      lib->add(chaiscript::fun(
                   [](const std::function<chaiscript::Boxed_Value()> &t_func) { return std::async(std::launch::async, t_func); }),
               "async");
#endif

      json_wrap::library(*lib);

      lib->eval(ChaiScript_Prelude::chaiscript_prelude() /*, "standard prelude"*/);

      return lib;
    }